

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalNinjaGenerator::ConvertToNinjaPath
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,string *path)

{
  cmLocalGenerator *this_00;
  cmState *this_01;
  char *pcVar1;
  allocator local_41;
  string local_40;
  
  this_00 = *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  this_01 = cmLocalGenerator::GetState(this_00);
  pcVar1 = cmState::GetBinaryDirectory(this_01);
  std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
  cmOutputConverter::ConvertToRelativePath
            (__return_storage_ptr__,&this_00->super_cmOutputConverter,&local_40,path);
  std::__cxx11::string::~string((string *)&local_40);
  NinjaOutputPath(&local_40,this,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::ConvertToNinjaPath(
  const std::string& path) const
{
  cmLocalNinjaGenerator* ng =
    static_cast<cmLocalNinjaGenerator*>(this->LocalGenerators[0]);
  std::string convPath = ng->ConvertToRelativePath(
    this->LocalGenerators[0]->GetState()->GetBinaryDirectory(), path);
  convPath = this->NinjaOutputPath(convPath);
#ifdef _WIN32
  std::replace(convPath.begin(), convPath.end(), '/', '\\');
#endif
  return convPath;
}